

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O1

int convtable(lua_State *L)

{
  table *ptVar1;
  value vVar2;
  int iVar3;
  context *ctx;
  size_t sVar4;
  uint8_t *puVar5;
  value *pvVar6;
  lua_Integer lVar7;
  char *pcVar8;
  node *pnVar9;
  table *in_RCX;
  long lVar10;
  node *pnVar11;
  ulong uVar12;
  int *in_R9;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  int key;
  int keytype;
  uint32_t keyhash;
  node n;
  uint local_68;
  uint local_64;
  table *local_60;
  value local_54;
  undefined4 uStack_4c;
  uint8_t local_3b;
  size_t local_38;
  
  ctx = (context *)lua_touserdata(L,2);
  ptVar1 = ctx->tbl;
  ptVar1->L = ctx->L;
  sVar4 = lua_rawlen(L,1);
  uVar13 = (uint)sVar4;
  if (uVar13 != 0) {
    puVar5 = (uint8_t *)malloc((long)(int)uVar13);
    ptVar1->arraytype = puVar5;
    if (puVar5 == (uint8_t *)0x0) goto LAB_0012462e;
    if (0 < (int)uVar13) {
      in_RCX = (table *)0x0;
      do {
        ptVar1->arraytype[(long)in_RCX] = '\0';
        in_RCX = (table *)((long)&in_RCX->sizearray + 1);
      } while ((table *)(ulong)(uVar13 & 0x7fffffff) != in_RCX);
    }
    pvVar6 = (value *)malloc((long)(sVar4 << 0x20) >> 0x1d);
    ptVar1->array = pvVar6;
    if (pvVar6 == (value *)0x0) goto LAB_0012462e;
    ptVar1->sizearray = uVar13;
  }
  local_60 = (table *)CONCAT44(local_60._4_4_,uVar13);
  lua_pushnil(L);
  iVar3 = lua_next(L,1);
  local_38 = sVar4;
  if (iVar3 == 0) {
    uVar15 = 0;
  }
  else {
    uVar15 = 0;
    do {
      iVar3 = lua_type(L,-2);
      uVar14 = uVar15 + 1;
      if (iVar3 == 3) {
        iVar3 = lua_isinteger(L,-2);
        if (iVar3 == 0) {
          lua_tonumberx(L,-2,(int *)0x0);
          luaL_error(L,"Invalid key %f");
        }
        lVar7 = lua_tointegerx(L,-2,(int *)0x0);
        if ((int)uVar13 < lVar7) {
          uVar15 = uVar14;
        }
        if (lVar7 < 1) {
          uVar15 = uVar14;
        }
      }
      else {
        in_RCX = (table *)(ulong)(iVar3 - 6U);
        uVar15 = uVar14;
        if (iVar3 - 6U < 0xfffffffe) {
          pcVar8 = lua_typename(L,iVar3);
          luaL_error(L,"Invalid key type %s",pcVar8);
        }
      }
      lua_settop(L,-2);
      iVar3 = lua_next(L,1);
    } while (iVar3 != 0);
  }
  if (uVar15 == 0) {
    if (0 < (int)local_60) {
      iVar3 = (int)local_38;
      uVar16 = 1;
      do {
        lua_rawgeti(L,1,uVar16);
        setvalue(ctx,L,(int)&local_54 + 4,(node *)in_RCX);
        ptVar1 = ctx->tbl;
        ptVar1->arraytype[uVar16 - 1] = local_3b;
        in_RCX = (table *)CONCAT44(uStack_4c,local_54.d._4_4_);
        ptVar1->array[uVar16 - 1].tbl = in_RCX;
        lua_settop(L,-2);
        uVar16 = uVar16 + 1;
      } while (iVar3 + 1 != uVar16);
    }
  }
  else {
    pnVar9 = (node *)malloc((long)(int)uVar15 * 0x18);
    ptVar1->hash = pnVar9;
    if (pnVar9 == (node *)0x0) {
LAB_0012462e:
      iVar3 = luaL_error(L,"memory error");
      return iVar3;
    }
    if (0 < (int)uVar15) {
      lVar10 = 0;
      do {
        *(undefined2 *)(&pnVar9->valuetype + lVar10) = 0;
        lVar10 = lVar10 + 0x18;
      } while ((ulong)uVar15 * 0x18 != lVar10);
    }
    ptVar1->sizehash = uVar15;
    local_60 = ctx->tbl;
    lua_pushnil(L);
    iVar3 = lua_next(L,1);
    if (iVar3 != 0) {
      do {
        pvVar6 = &local_54;
        iVar3 = ishashkey(ctx,L,(int)&local_68,&local_54.string,&local_64,in_R9);
        if (iVar3 == 0) {
          lVar10 = (long)(int)local_68;
          setvalue(ctx,L,(int)&local_54 + 4,(node *)pvVar6);
          ptVar1 = ctx->tbl;
          ptVar1->arraytype[lVar10 + -1] = local_3b;
          vVar2.d._4_4_ = uStack_4c;
          vVar2.string = local_54.d._4_4_;
          ptVar1->array[lVar10 + -1] = vVar2;
        }
        else {
          uVar16 = (ulong)(uint)local_54.string % (ulong)(uint)local_60->sizehash;
          if (local_60->hash[uVar16].valuetype == '\0') {
            pnVar9 = local_60->hash + uVar16;
            pnVar9->key = local_68;
            pnVar9->keytype = (uint8_t)local_64;
            pnVar9->keyhash = local_54.string;
            pnVar9->next = -1;
            pnVar9->nocolliding = '\x01';
            setvalue(ctx,L,(int)pnVar9,(node *)(ulong)(uint)local_54.string);
          }
        }
        lua_settop(L,-2);
        iVar3 = lua_next(L,1);
      } while (iVar3 != 0);
    }
    ptVar1 = ctx->tbl;
    uVar13 = ptVar1->sizehash;
    lua_pushnil(L);
    iVar3 = lua_next(L,1);
    if (iVar3 != 0) {
      do {
        iVar3 = ishashkey(ctx,L,(int)&local_54 + 4,(int *)&local_64,&local_68,in_R9);
        if (iVar3 != 0) {
          pnVar9 = ptVar1->hash;
          uVar16 = (ulong)local_64 % (ulong)(uint)ptVar1->sizehash;
          if ((local_68 != pnVar9[uVar16].keytype) || (pnVar9[uVar16].key != local_54.d._4_4_)) {
            pnVar11 = pnVar9;
            uVar12 = (ulong)uVar13;
            if (0 < (int)uVar13) {
              do {
                if (pnVar11->valuetype == '\0') goto LAB_001245bf;
                pnVar11 = pnVar11 + 1;
                uVar12 = uVar12 - 1;
              } while (uVar12 != 0);
            }
            pnVar11 = (node *)0x0;
LAB_001245bf:
            if (pnVar11 == (node *)0x0) {
              __assert_fail("n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/lualib-src/lua-sharedata.c"
                            ,0x103,"void fillcolliding(lua_State *, struct context *)");
            }
            pnVar11->next = pnVar9[uVar16].next;
            pnVar9[uVar16].next = (int)((ulong)((long)pnVar11 - (long)pnVar9) >> 3) * -0x55555555;
            pnVar9[uVar16].nocolliding = '\0';
            pnVar11->key = local_54.d._4_4_;
            pnVar11->keytype = (uint8_t)local_68;
            pnVar11->keyhash = local_64;
            pnVar11->nocolliding = '\0';
            setvalue(ctx,L,(int)pnVar11,(node *)(ulong)local_64);
          }
        }
        lua_settop(L,-2);
        iVar3 = lua_next(L,1);
      } while (iVar3 != 0);
    }
  }
  return 0;
}

Assistant:

static int
convtable(lua_State *L) {
	int i;
	struct context *ctx = lua_touserdata(L,2);
	struct table *tbl = ctx->tbl;

	tbl->L = ctx->L;

	int sizearray = lua_rawlen(L, 1);
	if (sizearray) {
		tbl->arraytype = (uint8_t *)malloc(sizearray * sizeof(uint8_t));
		if (tbl->arraytype == NULL) {
			goto memerror;
		}
		for (i=0;i<sizearray;i++) {
			tbl->arraytype[i] = VALUETYPE_NIL;
		}
		tbl->array = (union value *)malloc(sizearray * sizeof(union value));
		if (tbl->array == NULL) {
			goto memerror;
		}
		tbl->sizearray = sizearray;
	}
	int sizehash = countsize(L, sizearray);
	if (sizehash) {
		tbl->hash = (struct node *)malloc(sizehash * sizeof(struct node));
		if (tbl->hash == NULL) {
			goto memerror;
		}
		for (i=0;i<sizehash;i++) {
			tbl->hash[i].valuetype = VALUETYPE_NIL;
			tbl->hash[i].nocolliding = 0;
		}
		tbl->sizehash = sizehash;

		fillnocolliding(L, ctx);
		fillcolliding(L, ctx);
	} else {
		int i;
		for (i=1;i<=sizearray;i++) {
			lua_rawgeti(L, 1, i);
			setarray(ctx, L, -1, i);
			lua_pop(L,1);
		}
	}

	return 0;
memerror:
	return luaL_error(L, "memory error");
}